

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O2

size_t portability_path_get_directory_inplace(char *path,size_t size)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (path == (char *)0x0) {
    return 0;
  }
  uVar3 = 0;
  uVar2 = 0;
  while ((uVar3 < size && (pcVar1 = path + uVar3, *pcVar1 != '\0'))) {
    uVar3 = uVar3 + 1;
    if (*pcVar1 == '/') {
      uVar2 = uVar3;
    }
  }
  path[uVar2] = '\0';
  return uVar2 + 1;
}

Assistant:

size_t portability_path_get_directory_inplace(char *path, size_t size)
{
	if (path == NULL)
	{
		return 0;
	}

	size_t i, last;

	for (i = 0, last = 0; path[i] != '\0' && i < size; ++i)
	{
		if (PORTABILITY_PATH_SEPARATOR(path[i]))
		{
			last = i + 1;
		}
	}

	path[last] = '\0';

	return last + 1;
}